

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode_structs.hpp
# Opt level: O0

bool plot::detail::unicode_cp_in_tree<void>(char32_t cp,unicode_interval_tree_t *tree)

{
  unicode_interval_tree_t *local_20;
  unicode_interval_tree_t *local_18;
  unicode_interval_tree_t *tree_local;
  char32_t cp_local;
  
  local_18 = tree;
  while( true ) {
    if (local_18 == (unicode_interval_tree_t *)0x0) {
      return false;
    }
    if (((uint)(local_18->interval).first <= (uint)cp) &&
       ((uint)cp <= (uint)(local_18->interval).second)) break;
    if ((uint)cp < (uint)local_18->center) {
      local_20 = local_18->left;
    }
    else {
      local_20 = local_18->right;
    }
    local_18 = local_20;
  }
  return true;
}

Assistant:

bool unicode_cp_in_tree(char32_t cp, unicode_interval_tree_t const* tree) {
        while (tree) {
            if (cp >= tree->interval.first && cp <= tree->interval.second)
                return true;

            tree = (cp < tree->center) ? tree->left : tree->right;
        }

        return false;
    }